

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbutton.cpp
# Opt level: O0

void __thiscall QToolButtonPrivate::popupTimerDone(QToolButtonPrivate *this)

{
  bool bVar1;
  bool bVar2;
  Orientation OVar3;
  QToolButton *pQVar4;
  QMenu *pQVar5;
  qsizetype qVar6;
  QToolBar *pQVar7;
  QMenuPrivate *in_RDI;
  long in_FS_OFFSET;
  QToolBar *tb;
  bool horizontal;
  int i;
  bool mustDeleteActualMenu;
  QToolButton *q;
  QPoint initialPos;
  QPointer<QToolButton> that;
  QPointer<QMenu> actualMenu;
  anon_class_16_2_6d8a6aca positionFunction;
  QWidget *in_stack_fffffffffffffe68;
  code *p;
  QWidget *in_stack_fffffffffffffe70;
  QToolButtonPrivate *receiverPrivate;
  undefined7 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7f;
  QMenu *in_stack_fffffffffffffe80;
  QWidget *in_stack_fffffffffffffe88;
  QMenu *in_stack_fffffffffffffe90;
  PositionFunction *in_stack_fffffffffffffea0;
  QAction *in_stack_fffffffffffffea8;
  QPoint *in_stack_fffffffffffffeb0;
  undefined8 in_stack_fffffffffffffec0;
  ConnectionType type;
  Object *in_stack_fffffffffffffec8;
  Object *in_stack_fffffffffffffed0;
  Function in_stack_fffffffffffffef0;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  undefined1 local_c9;
  int local_c8;
  Connection local_58;
  code *local_50;
  undefined8 local_48;
  Connection local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  QToolButton *local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = q_func((QToolButtonPrivate *)in_RDI);
  QBasicTimer::stop();
  if (((*(byte *)((long)&(in_RDI->activeMenu).wp.d + 4) >> 2 & 1) == 0) &&
     ((*(byte *)((long)&in_RDI->currentAction + 4) >> 4 & 1) == 0)) goto LAB_0070ac85;
  *(byte *)((long)&(in_RDI->activeMenu).wp.d + 4) =
       *(byte *)((long)&(in_RDI->activeMenu).wp.d + 4) & 0xfb | 4;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  QPointer<QMenu>::QPointer((QPointer<QMenu> *)0x70a606);
  bVar1 = false;
  bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QAction> *)0x70a61f);
  type = (ConnectionType)((ulong)in_stack_fffffffffffffec0 >> 0x20);
  if (bVar2) {
    QPointer<QAction>::operator->((QPointer<QAction> *)0x70a636);
    QAction::menu<QMenu*>((QAction *)0x70a63e);
    QPointer<QMenu>::operator=
              ((QPointer<QMenu> *)in_stack_fffffffffffffe70,(QMenu *)in_stack_fffffffffffffe68);
  }
  else {
    if ((QAction *)(in_RDI->activeMenu).wp.value != (QAction *)0x0) {
      pQVar5 = QAction::menu<QMenu*>((QAction *)0x70a673);
      type = (ConnectionType)((ulong)in_stack_fffffffffffffec0 >> 0x20);
      if (pQVar5 != (QMenu *)0x0) {
        QAction::menu<QMenu*>((QAction *)0x70a68a);
        QPointer<QMenu>::operator=
                  ((QPointer<QMenu> *)in_stack_fffffffffffffe70,(QMenu *)in_stack_fffffffffffffe68);
        goto LAB_0070a75d;
      }
    }
    in_stack_fffffffffffffeb0 = (QPoint *)operator_new(0x28);
    QMenu::QMenu(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    QPointer<QMenu>::operator=
              ((QPointer<QMenu> *)in_stack_fffffffffffffe70,(QMenu *)in_stack_fffffffffffffe68);
    bVar1 = true;
    local_c8 = 0;
    while( true ) {
      in_stack_fffffffffffffea8 = (QAction *)(long)local_c8;
      qVar6 = QList<QAction_*>::size
                        (&(((QAbstractButtonPrivate *)&in_RDI->super_QWidgetPrivate)->
                          super_QWidgetPrivate).actions);
      type = (ConnectionType)((ulong)in_stack_fffffffffffffec0 >> 0x20);
      if (qVar6 <= (long)in_stack_fffffffffffffea8) break;
      in_stack_fffffffffffffea0 =
           (PositionFunction *)QPointer<QMenu>::operator->((QPointer<QMenu> *)0x70a71b);
      QList<QAction_*>::at
                ((QList<QAction_*> *)in_stack_fffffffffffffe70,(qsizetype)in_stack_fffffffffffffe68)
      ;
      QWidget::addAction(in_stack_fffffffffffffe70,(QAction *)in_stack_fffffffffffffe68);
      local_c8 = local_c8 + 1;
    }
  }
LAB_0070a75d:
  bVar2 = QAbstractButton::autoRepeat((QAbstractButton *)in_stack_fffffffffffffe70);
  *(byte *)((long)&(in_RDI->activeMenu).wp.d + 4) =
       *(byte *)((long)&(in_RDI->activeMenu).wp.d + 4) & 0xef | bVar2 << 4;
  QAbstractButton::setAutoRepeat
            ((QAbstractButton *)in_stack_fffffffffffffe80,(bool)in_stack_fffffffffffffe7f);
  local_c9 = 1;
  pQVar7 = qobject_cast<QToolBar*>((QObject *)0x70a7b5);
  if ((pQVar7 != (QToolBar *)0x0) &&
     (OVar3 = QToolBar::orientation((QToolBar *)in_stack_fffffffffffffe70), OVar3 == Vertical)) {
    local_c9 = 0;
  }
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  QPointer<QToolButton>::QPointer<void>
            ((QPointer<QToolButton> *)in_stack_fffffffffffffe70,
             (QToolButton *)in_stack_fffffffffffffe68);
  QPointer<QMenu>::operator->((QPointer<QMenu> *)0x70a822);
  QMenu::setNoReplayFor((QMenu *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  if (!bVar1) {
    ::QPointer::operator_cast_to_QMenu_((QPointer<QMenu> *)0x70a84d);
    local_50 = onMenuTriggered;
    local_48 = 0;
    QObjectPrivate::connect<void(QMenu::*)(QAction*),void(QToolButtonPrivate::*)(QAction*)>
              (in_stack_fffffffffffffed0,
               CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               in_stack_fffffffffffffec8,in_stack_fffffffffffffef0,type);
    QMetaObject::Connection::~Connection(&local_40);
  }
  ::QPointer::operator_cast_to_QMenu_((QPointer<QMenu> *)0x70a8dd);
  p = updateButtonDown;
  receiverPrivate = (Object *)0x0;
  QObjectPrivate::connect<void(QMenu::*)(),void(QToolButtonPrivate::*)()>
            (in_stack_fffffffffffffed0,CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00)
             ,in_stack_fffffffffffffec8,in_stack_fffffffffffffef0,type);
  QMetaObject::Connection::~Connection(&local_58);
  QPointer<QMenu>::operator->((QPointer<QMenu> *)0x70a97a);
  QMenu::d_func((QMenu *)0x70a982);
  QPointer<QWidget>::operator=((QPointer<QWidget> *)receiverPrivate,(QWidget *)p);
  QPointer<QMenu>::operator->((QPointer<QMenu> *)0x70a9b4);
  QMenu::d_func((QMenu *)0x70a9bc);
  QPointer<QAction>::operator=((QPointer<QAction> *)receiverPrivate,(QAction *)p);
  QWidget::actions((QWidget *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
  QList<QAction_*>::operator=((QList<QAction_*> *)receiverPrivate,(QList<QAction_*> *)p);
  QList<QAction_*>::~QList((QList<QAction_*> *)0x70aa0f);
  local_10 = CONCAT71(0xaaaaaaaaaaaaaa,local_c9);
  local_18 = pQVar4;
  pQVar5 = QPointer<QMenu>::operator->((QPointer<QMenu> *)0x70aa69);
  (**(code **)(*(long *)&pQVar5->super_QWidget + 0x70))();
  popupTimerDone::anon_class_16_2_6d8a6aca::operator()
            ((anon_class_16_2_6d8a6aca *)p,(QSize *)0x70aa8f);
  QPointer<QMenu>::operator->((QPointer<QMenu> *)0x70aaa4);
  QMenu::d_func((QMenu *)0x70aaac);
  std::function<QPoint(QSize_const&)>::function<QToolButtonPrivate::popupTimerDone()::__0&,void>
            ((function<QPoint_(const_QSize_&)> *)receiverPrivate,(anon_class_16_2_6d8a6aca *)p);
  QMenuPrivate::exec(in_RDI,in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                     in_stack_fffffffffffffea0);
  std::function<QPoint_(const_QSize_&)>::~function((function<QPoint_(const_QSize_&)> *)0x70aaf1);
  bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QToolButton> *)0x70aafe);
  if (bVar2) {
    ::QPointer::operator_cast_to_QMenu_((QPointer<QMenu> *)0x70ab1f);
    QObjectPrivate::disconnect<void(QMenu::*)(),void(QToolButtonPrivate::*)()>
              ((Object *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
               (offset_in_QMenu_to_subr)in_stack_fffffffffffffeb0,receiverPrivate,
               (Function)in_stack_fffffffffffffea0);
    if ((*(byte *)((long)&(in_RDI->activeMenu).wp.d + 4) >> 2 & 1) != 0) {
      updateButtonDown(receiverPrivate);
    }
    if (bVar1) {
      in_stack_fffffffffffffe80 = ::QPointer::operator_cast_to_QMenu_((QPointer<QMenu> *)0x70abb5);
      if (in_stack_fffffffffffffe80 != (QMenu *)0x0) {
        (**(code **)(*(long *)&in_stack_fffffffffffffe80->super_QWidget + 0x20))();
      }
    }
    else {
      ::QPointer::operator_cast_to_QMenu_((QPointer<QMenu> *)0x70abda);
      QObjectPrivate::disconnect<void(QMenu::*)(QAction*),void(QToolButtonPrivate::*)(QAction*)>
                ((Object *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
                 (offset_in_QMenu_to_subr)in_stack_fffffffffffffeb0,receiverPrivate,
                 (Function)in_stack_fffffffffffffea0);
    }
    QList<QAction_*>::clear((QList<QAction_*> *)receiverPrivate);
    if ((*(byte *)((long)&(in_RDI->activeMenu).wp.d + 4) >> 4 & 1) != 0) {
      QAbstractButton::setAutoRepeat
                ((QAbstractButton *)in_stack_fffffffffffffe80,(bool)in_stack_fffffffffffffe7f);
    }
  }
  QPointer<QToolButton>::~QPointer((QPointer<QToolButton> *)0x70ac78);
  QPointer<QMenu>::~QPointer((QPointer<QMenu> *)0x70ac85);
LAB_0070ac85:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QToolButtonPrivate::popupTimerDone()
{
    Q_Q(QToolButton);
    popupTimer.stop();
    if (!menuButtonDown && !down)
        return;

    menuButtonDown = true;
    QPointer<QMenu> actualMenu;
    bool mustDeleteActualMenu = false;
    if (menuAction) {
        actualMenu = menuAction->menu();
    } else if (defaultAction && defaultAction->menu()) {
        actualMenu = defaultAction->menu();
    } else {
        actualMenu = new QMenu(q);
        mustDeleteActualMenu = true;
        for (int i = 0; i < actions.size(); i++)
            actualMenu->addAction(actions.at(i));
    }
    repeat = q->autoRepeat();
    q->setAutoRepeat(false);
    bool horizontal = true;
#if QT_CONFIG(toolbar)
    QToolBar *tb = qobject_cast<QToolBar*>(parent);
    if (tb && tb->orientation() == Qt::Vertical)
        horizontal = false;
#endif
    QPointer<QToolButton> that = q;
    actualMenu->setNoReplayFor(q);
    if (!mustDeleteActualMenu) { //only if action are not in this widget
        QObjectPrivate::connect(actualMenu, &QMenu::triggered,
                                this, &QToolButtonPrivate::onMenuTriggered);
    }
    QObjectPrivate::connect(actualMenu, &QMenu::aboutToHide,
                            this, &QToolButtonPrivate::updateButtonDown);
    actualMenu->d_func()->causedPopup.widget = q;
    actualMenu->d_func()->causedPopup.action = defaultAction;
    actionsCopy = q->actions(); //(the list of action may be modified in slots)

    // QTBUG-78966, Delay positioning until after aboutToShow().
    auto positionFunction = [q, horizontal](const QSize &sizeHint) {
        return positionMenu(q, horizontal, sizeHint); };
    const auto initialPos = positionFunction(actualMenu->sizeHint());
    actualMenu->d_func()->exec(initialPos, nullptr, positionFunction);

    if (!that)
        return;

    QObjectPrivate::disconnect(actualMenu, &QMenu::aboutToHide,
                               this, &QToolButtonPrivate::updateButtonDown);
    if (menuButtonDown) {
        // The menu was empty, it didn't actually show up, so it was never hidden either
        updateButtonDown();
    }

    if (mustDeleteActualMenu) {
        delete actualMenu;
    } else {
        QObjectPrivate::disconnect(actualMenu, &QMenu::triggered,
                                   this, &QToolButtonPrivate::onMenuTriggered);
    }

    actionsCopy.clear();

    if (repeat)
        q->setAutoRepeat(true);
}